

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeComment(XmlWriter *this,string *text,XmlFormatting fmt)

{
  bool bVar1;
  ostream *poVar2;
  XmlFormatting fmt_local;
  string *text_local;
  XmlWriter *this_local;
  
  ensureTagClosed(this);
  bVar1 = anon_unknown_1::shouldIndent(fmt);
  if (bVar1) {
    std::operator<<(this->m_os,(string *)&this->m_indent);
  }
  poVar2 = std::operator<<(this->m_os,"<!--");
  poVar2 = std::operator<<(poVar2,(string *)text);
  std::operator<<(poVar2,"-->");
  applyFormatting(this,fmt);
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeComment( std::string const& text, XmlFormatting fmt) {
        ensureTagClosed();
        if (shouldIndent(fmt)) {
            m_os << m_indent;
        }
        m_os << "<!--" << text << "-->";
        applyFormatting(fmt);
        return *this;
    }